

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  pointer ppTVar1;
  pointer pcVar2;
  IConfig *pIVar3;
  
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__JunitReporter_00165138;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stdErr);
  std::ios_base::~ios_base((ios_base *)&this->field_0x2a0);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stdOut);
  std::ios_base::~ios_base((ios_base *)&this->field_0x128);
  ppTVar1 = (this->m_currentTestCaseStats).
            super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppTVar1 != (pointer)0x0) {
    operator_delete(ppTVar1);
  }
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::~vector
            (&this->m_statsForSuites);
  std::
  vector<Catch::JunitReporter::TestCaseStats,_std::allocator<Catch::JunitReporter::TestCaseStats>_>
  ::~vector(&(this->m_testSuiteStats).m_testCaseStats);
  pcVar2 = (this->m_testSuiteStats).m_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_testSuiteStats).m_name.field_2) {
    operator_delete(pcVar2);
  }
  pIVar3 = (this->m_config).m_fullConfig.m_p;
  if (pIVar3 != (IConfig *)0x0) {
    (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[3])();
  }
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}